

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

void __thiscall network_pimpl::decode(network_pimpl *this,binarydata *data)

{
  undefined8 in_RAX;
  int tsource;
  int tacq;
  
  _tsource = in_RAX;
  NetworkDataType::
  deserializedata<std::__cxx11::string,std::__cxx11::string,int,std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::vector<EventDataType,std::allocator<EventDataType>>,std::vector<HighFreqDataType,std::allocator<HighFreqDataType>>,int,int,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
            (data,&this->endpoint,&this->address,&this->port,&this->clients,&this->events,
             &this->hfdts,&tsource,&tacq,&this->trodes_filename,&this->hardware_endpoint,
             &this->hardware_address,&this->hardware_port,&this->timestamp_endpoint);
  this->trodes_source = tsource;
  this->trodes_acquisition = tacq;
  return;
}

Assistant:

void network_pimpl::decode(const binarydata &data){
    int tsource, tacq;
    NetworkDataType::deserializedata(data, endpoint, address, port, clients, events, hfdts,
                                     tsource, tacq, trodes_filename,
                                     hardware_endpoint, hardware_address, hardware_port,
                                     timestamp_endpoint);
    trodes_source = (TrodesSource)tsource;
    trodes_acquisition = (TrodesAcquisition)tacq;
}